

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

void op_extract_jpeg_params
               (uchar *_buf,size_t _buf_sz,opus_uint32 *_width,opus_uint32 *_height,
               opus_uint32 *_depth,opus_uint32 *_colors,int *_has_palette)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  int marker;
  size_t segment_len;
  size_t offs;
  opus_uint32 *_colors_local;
  opus_uint32 *_depth_local;
  opus_uint32 *_height_local;
  opus_uint32 *_width_local;
  size_t _buf_sz_local;
  uchar *_buf_local;
  
  iVar2 = op_is_jpeg(_buf,_buf_sz);
  if (iVar2 != 0) {
    segment_len = 2;
    sVar3 = segment_len;
    while( true ) {
      do {
        while( true ) {
          segment_len = sVar3;
          bVar5 = false;
          if (segment_len < _buf_sz) {
            bVar5 = _buf[segment_len] != 0xff;
          }
          if (!bVar5) break;
          sVar3 = segment_len + 1;
        }
        while( true ) {
          bVar5 = false;
          if (segment_len < _buf_sz) {
            bVar5 = _buf[segment_len] == 0xff;
          }
          if (!bVar5) break;
          segment_len = segment_len + 1;
        }
        bVar1 = _buf[segment_len];
        sVar3 = segment_len + 1;
        if (_buf_sz <= sVar3) {
          return;
        }
        if ((0xd7 < bVar1) && (bVar1 < 0xdb)) {
          return;
        }
      } while ((0xcf < bVar1) && (bVar1 < 0xd8));
      if (_buf_sz - sVar3 < 2) {
        return;
      }
      uVar4 = (ulong)(int)(uint)CONCAT11(_buf[sVar3],_buf[segment_len + 2]);
      if (uVar4 < 2) {
        return;
      }
      if (_buf_sz - sVar3 < uVar4) {
        return;
      }
      if ((bVar1 == 0xc0) || (((0xc0 < bVar1 && (bVar1 < 0xd0)) && ((bVar1 & 3) != 0)))) break;
      sVar3 = uVar4 + sVar3;
    }
    if (7 < uVar4) {
      *_height = (uint)CONCAT11(_buf[segment_len + 4],_buf[segment_len + 5]);
      *_width = (uint)CONCAT11(_buf[segment_len + 6],_buf[segment_len + 7]);
      *_depth = (uint)_buf[segment_len + 3] * (uint)_buf[segment_len + 8];
      *_colors = 0;
      *_has_palette = 0;
    }
  }
  return;
}

Assistant:

static void op_extract_jpeg_params(const unsigned char *_buf,size_t _buf_sz,
 opus_uint32 *_width,opus_uint32 *_height,
 opus_uint32 *_depth,opus_uint32 *_colors,int *_has_palette){
  if(op_is_jpeg(_buf,_buf_sz)){
    size_t offs;
    offs=2;
    for(;;){
      size_t segment_len;
      int    marker;
      while(offs<_buf_sz&&_buf[offs]!=0xFF)offs++;
      while(offs<_buf_sz&&_buf[offs]==0xFF)offs++;
      marker=_buf[offs];
      offs++;
      /*If we hit EOI* (end of image), or another SOI* (start of image),
         or SOS (start of scan), then stop now.*/
      if(offs>=_buf_sz||(marker>=0xD8&&marker<=0xDA))break;
      /*RST* (restart markers): skip (no segment length).*/
      else if(marker>=0xD0&&marker<=0xD7)continue;
      /*Read the length of the marker segment.*/
      if(_buf_sz-offs<2)break;
      segment_len=_buf[offs]<<8|_buf[offs+1];
      if(segment_len<2||_buf_sz-offs<segment_len)break;
      if(marker==0xC0||(marker>0xC0&&marker<0xD0&&(marker&3)!=0)){
        /*Found a SOFn (start of frame) marker segment:*/
        if(segment_len>=8){
          *_height=_buf[offs+3]<<8|_buf[offs+4];
          *_width=_buf[offs+5]<<8|_buf[offs+6];
          *_depth=_buf[offs+2]*_buf[offs+7];
          *_colors=0;
          *_has_palette=0;
        }
        break;
      }
      /*Other markers: skip the whole marker segment.*/
      offs+=segment_len;
    }
  }
}